

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

LispPTR rplacd(LispPTR x,LispPTR y)

{
  uint uVar1;
  DLword *pDVar2;
  ushort uVar3;
  LispPTR LVar4;
  LispPTR *pLVar5;
  conspage *page;
  ConsCell *pCVar6;
  conspage *cons68k;
  DLword cdr_code;
  LispPTR rp_page;
  LispPTR cdr_cell;
  ConsCell *cdr_cell68k;
  ConsCell *temp68k;
  ConsCell *x_68k;
  LispPTR y_local;
  LispPTR x_local;
  
  y_local = x;
  if ((*(ushort *)((ulong)(MDStypetbl + (x >> 9)) ^ 2) & 0x7ff) == 5) {
    pLVar5 = NativeAligned4FromLAddr(x);
    pDVar2 = MDStypetbl;
    LVar4 = cdr(x);
    if (((*(ushort *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        LVar4 = cdr(x);
        rec_htfind(LVar4,1);
      }
      else {
        LVar4 = cdr(x);
        htfind(LVar4,1);
      }
    }
    if (((*(ushort *)((ulong)(MDStypetbl + (y >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(y,0);
      }
      else {
        htfind(y,0);
      }
    }
    uVar3 = (ushort)(*pLVar5 >> 0x1c);
    if (uVar3 == 0) {
      uVar1 = *pLVar5;
      pLVar5 = NativeAligned4FromLAddr(uVar1 & 0xfffffff);
      pLVar5 = NativeAligned4FromLAddr((uVar1 & 0xfffffff) + (*pLVar5 >> 0x1c) * 2);
      *pLVar5 = y & 0xfffffff;
    }
    else if (uVar3 < 8) {
      pLVar5 = NativeAligned4FromLAddr(x + (uint)uVar3 * 2);
      *pLVar5 = y & 0xfffffff;
    }
    else if (y == 0) {
      *pLVar5 = *pLVar5 & 0xfffffff | 0x80000000;
    }
    else if ((((x & 0xfffff00) == (y & 0xfffff00)) && (x < y)) && (y <= x + 0xe)) {
      *pLVar5 = *pLVar5 & 0xfffffff | ((y - x >> 1) + 8) * 0x10000000;
    }
    else {
      page = (conspage *)NativeAligned4FromLAddr(x & 0xfffff00);
      if ((*(uint *)&page->field_0x8 >> 0x18 == 0) ||
         (pCVar6 = find_close_cell(page,x), pCVar6 == (ConsCell *)0x0)) {
        pCVar6 = find_cdrable_pair(x,y);
        *pCVar6 = (ConsCell)((uint)*pCVar6 & 0xf0000000 | *pLVar5 & 0xfffffff);
        LVar4 = LAddrFromNative(pCVar6);
        *pLVar5 = *pLVar5 & 0xf0000000 | LVar4 & 0xfffffff;
        *pLVar5 = *pLVar5 & 0xfffffff;
      }
      else {
        *pCVar6 = (ConsCell)(y & 0xfffffff);
        LVar4 = LAddrFromNative(pCVar6);
        *pLVar5 = *pLVar5 & 0xfffffff | (LVar4 - x >> 1) << 0x1c;
      }
    }
  }
  else if (x == 0) {
    if (y == 0) {
      y_local = 0;
    }
    else {
      error("Attempt to RPLACD NIL");
    }
  }
  else {
    error("ARG not List");
  }
  return y_local;
}

Assistant:

LispPTR rplacd(LispPTR x, LispPTR y)
{
  ConsCell *x_68k;
  ConsCell *temp68k;
  ConsCell *cdr_cell68k;
  LispPTR cdr_cell;
  LispPTR rp_page;
  DLword cdr_code;
  struct conspage *cons68k;

  if (Listp(x) == NIL) {
    if (x == NIL_PTR) {
      if (y != NIL_PTR)
        error("Attempt to RPLACD NIL");
      else
        return (NIL_PTR);
    } else
      error("ARG not List");
  }

  else {
    x_68k = (ConsCell *)NativeAligned4FromLAddr(x);

    GCLOOKUP(cdr(x), DELREF); /* set up reference count */
    GCLOOKUP(y, ADDREF);

    cdr_code = x_68k->cdr_code;

    if (cdr_code == CDR_INDIRECT) {
      /* cdr-indirect */

      rp_page = (LispPTR)x_68k->car_field;
      temp68k = (ConsCell *)NativeAligned4FromLAddr(rp_page);
#ifdef NEWCDRCODING
      cdr_cell = (rp_page) + (temp68k->cdr_code << 1);
#else
      cdr_cell = POINTER_PAGEBASE(rp_page) + (temp68k->cdr_code << 1);
#endif /* NEWCDRCODING */

      cdr_cell68k = (ConsCell *)NativeAligned4FromLAddr(cdr_cell);
      *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code is set to 0 */
    } else if (cdr_code <= CDR_MAXINDIRECT) {
/* cdr-differentpage */
#ifdef NEWCDRCODING
      cdr_cell = x + (cdr_code << 1);
#else
      cdr_cell = POINTER_PAGEBASE(x) + (cdr_code << 1);
#endif /* NEWCDRCODING */
      cdr_cell68k = (ConsCell *)NativeAligned4FromLAddr(cdr_cell);
      *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code is set to 0 */

    } else if (y == NIL_PTR)
      /* cdr-samepage & y is nil */
      x_68k->cdr_code = CDR_NIL;
#ifdef NEWCDRCODING
    else if (((rp_page = POINTER_PAGEBASE(x)) == POINTER_PAGEBASE(y)) && (y > x) && (y <= (x + 14)))
      /* cdr-samepage & x and y are on same page */
      x_68k->cdr_code = CDR_ONPAGE + ((y - x) >> 1);
#else
    else if ((rp_page = POINTER_PAGEBASE(x)) == POINTER_PAGEBASE(y))
      /* cdr-samepage & x and y are on same page */
      x_68k->cdr_code = CDR_ONPAGE + ((y & 0xff) >> 1);
#endif /* NEWCDRCODING */
    else {
      /* cdr-samepage & x and y are on different page */

      cons68k = (struct conspage *)(NativeAligned4FromLAddr(rp_page));
#ifdef NEWCDRCODING
      if ((cons68k->count > 0) && (cdr_cell68k = find_close_cell(cons68k, x))) {
        /* at least one free-cell on x's conspage */
        /* AND it's within CDR-code range of x. */

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        x_68k->cdr_code = (LAddrFromNative(cdr_cell68k) - x) >> 1;
      }
#else
      if (cons68k->count > 0) {
        /* at least one free-cell on x's conspage */
        cdr_cell68k = GetNewCell_68k(cons68k);
        cons68k->count--;
        cons68k->next_cell = ((freecons *)cdr_cell68k)->next_free;

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        x_68k->cdr_code = (LAddrFromNative(cdr_cell68k) - rp_page) >> 1;
      }
#endif /* NEWCDRCODING */
      else {
/* no more free-cell on x's conspage */
#ifdef NEWCDRCODING
        temp68k = (ConsCell *)find_cdrable_pair(x, y);
        temp68k->car_field = x_68k->car_field;
        x_68k->car_field = LAddrFromNative(temp68k);
        x_68k->cdr_code = CDR_INDIRECT;
#else
        cons68k = next_conspage();

        cdr_cell68k = GetNewCell_68k(cons68k);
        cons68k->next_cell = ((freecons *)cdr_cell68k)->next_free;
        temp68k = GetNewCell_68k(cons68k);
        cons68k->next_cell = ((freecons *)temp68k)->next_free;

        cons68k->count -= 2;

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        temp68k->car_field = x_68k->car_field;
        x_68k->car_field = LAddrFromNative(temp68k);

        temp68k->cdr_code = (LAddrFromNative(cdr_cell68k) & 0xff) >> 1;

        x_68k->cdr_code = CDR_INDIRECT;
#endif /* NEWCDRCODING */
      }
    }
  }